

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

PortPackedStruct * __thiscall
kratos::Generator::port_packed
          (Generator *this,PortDirection direction,string *port_name,
          shared_ptr<kratos::PackedStruct> *packed_struct_,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *size)

{
  PortPackedStruct *pPVar1;
  Generator *local_48;
  PortDirection local_3c;
  undefined1 auStack_38 [4];
  PortDirection direction_local;
  shared_ptr<kratos::PortPackedStruct> p;
  
  _auStack_38 = (PortPackedStruct *)0x0;
  local_48 = this;
  local_3c = direction;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::PortPackedStruct,std::allocator<kratos::PortPackedStruct>,kratos::Generator*,kratos::PortDirection&,std::__cxx11::string_const&,std::shared_ptr<kratos::PackedStruct>const&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p,(PortPackedStruct **)auStack_38,
             (allocator<kratos::PortPackedStruct> *)
             ((long)&p.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7),&local_48,&local_3c,port_name,packed_struct_,size);
  std::__shared_ptr<kratos::PortPackedStruct,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::PortPackedStruct,kratos::PortPackedStruct>
            ((__shared_ptr<kratos::PortPackedStruct,(__gnu_cxx::_Lock_policy)2> *)auStack_38,
             _auStack_38);
  (*(this->super_IRNode)._vptr_IRNode[7])(this,port_name);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
  ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::PortPackedStruct>&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
              *)&this->vars_,port_name,(shared_ptr<kratos::PortPackedStruct> *)auStack_38);
  pPVar1 = _auStack_38;
  if (p.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               p.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return pPVar1;
}

Assistant:

PortPackedStruct &Generator::port_packed(PortDirection direction, const std::string &port_name,
                                         const std::shared_ptr<PackedStruct> &packed_struct_,
                                         const std::vector<uint32_t> &size) {
    auto p = std::make_shared<PortPackedStruct>(this, direction, port_name, packed_struct_, size);
    add_port_name(port_name);
    vars_.emplace(port_name, p);
    return *p;
}